

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amplificationstobin.cpp
# Opt level: O3

void amplificationstobin::DoIt(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  item_amplification ia;
  char line [4096];
  uint local_1040;
  undefined1 local_103c [4];
  char local_1038 [4104];
  
  local_1038[0] = '\0';
  local_1038[1] = '\0';
  local_1038[2] = '\0';
  local_1038[3] = '\0';
  fwrite(local_1038,4,1,_stdout);
  fgets(local_1038,0x1000,_stdin);
  pcVar2 = fgets(local_1038,0x1000,_stdin);
  if (pcVar2 != (char *)0x0) {
    uVar3 = 2;
    do {
      iVar1 = __isoc99_sscanf(local_1038,"%d,%d",&local_1040,local_103c);
      if (iVar1 != 2) {
        DoIt();
      }
      if (uVar3 - 1 != local_1040) {
        fprintf(_stderr,
                "FATAL: Item IDs not contiguous:\nExpected item ID %d but read item ID %d on line %d\n"
                ,(ulong)(uVar3 - 1),(ulong)local_1040,(ulong)uVar3);
        exit(1);
      }
      uVar3 = uVar3 + 1;
      fwrite(&local_1040,8,1,_stdout);
      pcVar2 = fgets(local_1038,0x1000,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  return;
}

Assistant:

void DoIt() {

    WriteOpts();

    int expected_item_id = 1;
    item_amplification ia;
    char line[4096];

    fgets(line, sizeof(line), stdin);   // Skip header row
    int lineno = 2;

    while (fgets(line, sizeof(line), stdin) != 0) {

      if (sscanf(line, "%d,%d", &ia.item_id, &ia.amplification_id) != 2) {
        fprintf(stderr, "FATAL: Invalid data in line %d:\n%s\n", lineno, line);
	exit(EXIT_FAILURE);
      }

      if (expected_item_id != ia.item_id) {
        fprintf(stderr, "FATAL: Item IDs not contiguous:\n"
			"Expected item ID %d but read item ID %d on line %d\n",
			expected_item_id, ia.item_id, lineno);
	exit(EXIT_FAILURE);
      }

      ++lineno;
      ++expected_item_id;

      fwrite(&ia, sizeof(ia), 1, stdout);

    }

  }